

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_write_seed_file(mbedtls_entropy_context *ctx,char *path)

{
  FILE *__s;
  size_t sVar1;
  uchar local_78 [8];
  uchar buf [64];
  FILE *f;
  int ret;
  char *path_local;
  mbedtls_entropy_context *ctx_local;
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    ctx_local._4_4_ = -0x3f;
  }
  else {
    f._4_4_ = mbedtls_entropy_func(ctx,local_78,0x40);
    if (f._4_4_ == 0) {
      sVar1 = fwrite(local_78,1,0x40,__s);
      if (sVar1 == 0x40) {
        f._4_4_ = 0;
      }
      else {
        f._4_4_ = -0x3f;
      }
    }
    fclose(__s);
    ctx_local._4_4_ = f._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_entropy_write_seed_file( mbedtls_entropy_context *ctx, const char *path )
{
    int ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
    FILE *f;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( ( f = fopen( path, "wb" ) ) == NULL )
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );

    if( ( ret = mbedtls_entropy_func( ctx, buf, MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    if( fwrite( buf, 1, MBEDTLS_ENTROPY_BLOCK_SIZE, f ) != MBEDTLS_ENTROPY_BLOCK_SIZE )
    {
        ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
        goto exit;
    }

    ret = 0;

exit:
    fclose( f );
    return( ret );
}